

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathExtras.h
# Opt level: O2

DecodeStatus decodeCRBitMOperand(MCInst *Inst,uint64_t Imm,int64_t Address,void *Decoder)

{
  long lVar1;
  DecodeStatus DVar2;
  uint uVar3;
  
  if (Imm == 0) {
    uVar3 = 0x40;
  }
  else {
    lVar1 = 0;
    if (Imm != 0) {
      for (; (Imm >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
      }
    }
    uVar3 = (uint)lVar1;
  }
  DVar2 = MCDisassembler_Fail;
  if (uVar3 < 8) {
    MCOperand_CreateReg0(Inst,*(uint *)((long)CRRegs + (ulong)((7 - uVar3) * 4)));
    DVar2 = MCDisassembler_Success;
  }
  return DVar2;
}

Assistant:

static inline unsigned CountTrailingZeros_64(uint64_t Value) {
#if __GNUC__ >= 4
	return Value ? __builtin_ctzll(Value) : 64;
#else
	static const unsigned Mod67Position[] = {
		64, 0, 1, 39, 2, 15, 40, 23, 3, 12, 16, 59, 41, 19, 24, 54,
		4, 64, 13, 10, 17, 62, 60, 28, 42, 30, 20, 51, 25, 44, 55,
		47, 5, 32, 65, 38, 14, 22, 11, 58, 18, 53, 63, 9, 61, 27,
		29, 50, 43, 46, 31, 37, 21, 57, 52, 8, 26, 49, 45, 36, 56,
		7, 48, 35, 6, 34, 33, 0
	};
	// Replace "-Value" by "1+~Value" in the following commented code to avoid 
	// MSVC warning C4146
	//    return Mod67Position[(-Value & Value) % 67];
	return Mod67Position[((1 + ~Value) & Value) % 67];
#endif
}